

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* get_reference_map(string *reference)

{
  string *this;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string *this_01;
  char cVar1;
  bool bVar2;
  int iVar3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_02;
  char *__s;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  long local_328;
  ifstream ref_handle;
  byte abStack_308 [488];
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  string current_chr;
  undefined1 local_80 [8];
  string tmp_str;
  string buff_string;
  
  this_02 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             *)operator_new(0x30);
  *(undefined8 *)(this_02 + 0x10) = 0;
  *(undefined8 *)(this_02 + 0x18) = 0;
  *(undefined8 *)this_02 = 0;
  *(undefined8 *)(this_02 + 8) = 0;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    **)(this_02 + 0x18) = this_02 + 8;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    **)(this_02 + 0x20) = this_02 + 8;
  *(undefined8 *)(this_02 + 0x28) = 0;
  std::ifstream::ifstream(&local_328,(string *)reference,_S_in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"",(allocator<char> *)(current_chr.field_2._M_local_buf + 8));
  __s = (char *)calloc(0x400,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"",(allocator<char> *)(current_chr.field_2._M_local_buf + 8));
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    bVar2 = true;
    this = (string *)(tmp_str.field_2._M_local_buf + 8);
    while( true ) {
      std::istream::getline((char *)&local_328,(long)__s);
      if ((abStack_308[*(long *)(local_328 + -0x18)] & 2) != 0) break;
      std::__cxx11::string::string<std::allocator<char>>
                (this,__s,(allocator<char> *)(current_chr.field_2._M_local_buf + 8));
      current_chr.field_2._M_local_buf[8] = '\n';
      _Var4 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )tmp_str.field_2._8_8_,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(buff_string._M_dataplus._M_p + tmp_str.field_2._8_8_),
                         current_chr.field_2._M_local_buf + 8);
      std::__cxx11::string::erase
                (this,_Var4._M_current,buff_string._M_dataplus._M_p + tmp_str.field_2._8_8_);
      std::__cxx11::string::string((string *)&local_100,this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,">",(allocator<char> *)(current_chr.field_2._M_local_buf + 8))
      ;
      iVar3 = startsWith(&local_100,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      if (iVar3 == 0) {
        std::__cxx11::string::append((string *)local_80);
      }
      else {
        if (!bVar2) {
          this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(&current_chr.field_2._M_allocated_capacity + 1);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(this_02,this_00)
          ;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(this_00);
        }
        this_01 = (string *)(current_chr.field_2._M_local_buf + 8);
        std::__cxx11::string::substr((ulong)this_01,(ulong)this);
        std::__cxx11::string::operator=((string *)local_e0,this_01);
        std::__cxx11::string::~string(this_01);
        std::__cxx11::string::assign(local_80);
        bVar2 = false;
      }
      std::__cxx11::string::~string(this);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&current_chr.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              (this_02,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&current_chr.field_2 + 8));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&current_chr.field_2 + 8));
    std::ifstream::close();
  }
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_80);
  std::ifstream::~ifstream(&local_328);
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)this_02;
}

Assistant:

map<string,string> * get_reference_map(string reference){
    map<string,string> * ref = new map<string,string>();
    ifstream ref_handle (reference );
    string tmp_str="";
    char * buffer =  (char *)calloc(1024,sizeof(char));
    string current_chr = "";
    bool first = true;
    if (ref_handle.is_open()){
        while(1){
            ref_handle.getline(buffer,1024);
            if(!ref_handle.eof()){
                string buff_string(buffer);
                buff_string.erase(std::remove(buff_string.begin(), buff_string.end(), '\n'), buff_string.end());
                if (startsWith(buff_string,string(">"))) {
                    if (!first){
                        ref->insert ( std::pair<string,string>(current_chr,tmp_str) );
                    }else{
                        first = false;
                    }
                    current_chr =  buff_string.substr(1, buff_string.length() - 1);
                    tmp_str = "";
                }else{
                    tmp_str += buff_string;
                }
            }else{
                break;
            }
        }
        ref->insert ( std::pair<string,string>(current_chr,tmp_str) );
        ref_handle.close();

    }

    return ref;
}